

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdnode.cc
# Opt level: O0

void __thiscall bdNode::genNewTransId(bdNode *this,bdToken *token)

{
  undefined1 *puVar1;
  int local_4c;
  int local_48;
  int i;
  int len;
  undefined1 local_38 [8];
  string num;
  bdToken *token_local;
  bdNode *this_local;
  
  num.field_2._8_8_ = token;
  std::__cxx11::string::string((string *)local_38);
  transIdCounter = transIdCounter + 1;
  bd_sprintf((string *)local_38,"%02lx");
  local_48 = std::__cxx11::string::size();
  if (0x14 < local_48) {
    local_48 = 0x14;
  }
  for (local_4c = 0; local_4c < local_48; local_4c = local_4c + 1) {
    puVar1 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_38);
    *(undefined1 *)(num.field_2._8_8_ + 4 + (long)local_4c) = *puVar1;
  }
  *(int *)num.field_2._8_8_ = local_48;
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void bdNode::genNewTransId(bdToken *token) {
	/* generate message, send to udp */
#ifdef DEBUG_NODE_ACTIONS 
	fprintf(stderr, "bdNode::genNewTransId()");
	fprintf(stderr, ")\n");
#endif
	std::string num;
	bd_sprintf(num, "%02lx", transIdCounter++);
	int len = num.size();
	if (len > BITDHT_TOKEN_MAX_LEN)
		len = BITDHT_TOKEN_MAX_LEN;

	for (int i = 0; i < len; i++)
		token->data[i] = num[i];
	token->len = len;
}